

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpCodeUtil.cpp
# Opt level: O0

char16 * Js::OpCodeUtil::GetOpCodeName(OpCode op)

{
  code *pcVar1;
  bool bVar2;
  uint uVar3;
  undefined4 *puVar4;
  uint opIndex;
  uint opIndex_1;
  OpCode op_local;
  
  if (op < InvalidOpCode) {
    if (MaxByteSizedOpcodes < op) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/OpCodeUtil.cpp"
                                  ,0xd2,"((uint)op < (sizeof(*__countof_helper(OpCodeNames)) + 0))",
                                  "(uint)op < _countof(OpCodeNames)");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 0;
    }
    _opIndex_1 = *(char16 **)(OpCodeNames + (ulong)op * 8);
  }
  else if (op < ByteCodeLast) {
    uVar3 = Js::operator+(MaxByteSizedOpcodes,1);
    uVar3 = Js::operator-(op,uVar3);
    if (0x88 < uVar3) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/OpCodeUtil.cpp"
                                  ,0xd9,
                                  "(opIndex < (sizeof(*__countof_helper(ExtendedOpCodeNames)) + 0))"
                                  ,"opIndex < _countof(ExtendedOpCodeNames)");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 0;
    }
    _opIndex_1 = *(char16 **)(ExtendedOpCodeNames + (ulong)uVar3 * 8);
  }
  else {
    uVar3 = Js::operator+(ByteCodeLast,1);
    uVar3 = Js::operator-(op,uVar3);
    if (0x328 < uVar3) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/OpCodeUtil.cpp"
                                  ,0xde,
                                  "(opIndex < (sizeof(*__countof_helper(BackendOpCodeNames)) + 0))",
                                  "opIndex < _countof(BackendOpCodeNames)");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 0;
    }
    _opIndex_1 = *(char16 **)(BackendOpCodeNames + (ulong)uVar3 * 8);
  }
  return _opIndex_1;
}

Assistant:

char16 const * OpCodeUtil::GetOpCodeName(OpCode op)
    {
        if (op <= Js::OpCode::MaxByteSizedOpcodes)
        {
            Assert((uint)op < _countof(OpCodeNames));
            __analysis_assume((uint)op < _countof(OpCodeNames));
            return OpCodeNames[(uint)op];
        }
        else if (op < Js::OpCode::ByteCodeLast)
        {
            uint opIndex = op - (Js::OpCode::MaxByteSizedOpcodes + 1);
            Assert(opIndex < _countof(ExtendedOpCodeNames));
            __analysis_assume(opIndex < _countof(ExtendedOpCodeNames));
            return ExtendedOpCodeNames[opIndex];
        }
        uint opIndex = op - (Js::OpCode::ByteCodeLast + 1);
        Assert(opIndex < _countof(BackendOpCodeNames));
        __analysis_assume(opIndex < _countof(BackendOpCodeNames));
        return BackendOpCodeNames[opIndex];
    }